

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O0

int __thiscall
ON_LineCurve::GetNurbForm
          (ON_LineCurve *this,ON_NurbsCurve *c,double tolerance,ON_Interval *subdomain)

{
  double dVar1;
  bool bVar2;
  int dim;
  ON_3dPoint local_b8;
  ON_3dPoint local_a0;
  ON_3dPoint local_88;
  ON_3dPoint local_70;
  ON_Interval *local_58;
  double s1;
  double s0;
  ON_Interval *sd;
  double t1;
  double t0;
  ON_Interval *pOStack_28;
  int rc;
  ON_Interval *subdomain_local;
  double tolerance_local;
  ON_NurbsCurve *c_local;
  ON_LineCurve *this_local;
  
  t0._4_4_ = 0;
  dim = 3;
  if (this->m_dim == 2) {
    dim = 2;
  }
  pOStack_28 = subdomain;
  subdomain_local = (ON_Interval *)tolerance;
  tolerance_local = (double)c;
  c_local = (ON_NurbsCurve *)this;
  bVar2 = ON_NurbsCurve::Create(c,dim,false,2,2);
  if (bVar2) {
    t0._4_4_ = 1;
    t1 = ON_Interval::operator[](&this->m_t,0);
    sd = (ON_Interval *)ON_Interval::operator[](&this->m_t,1);
    if (pOStack_28 != (ON_Interval *)0x0) {
      if ((double)sd <= t1) {
        t0._4_4_ = 0;
      }
      else {
        s0 = (double)pOStack_28;
        s1 = ON_Interval::operator[](pOStack_28,0);
        local_58 = (ON_Interval *)ON_Interval::operator[]((ON_Interval *)s0,1);
        if (s1 < t1) {
          s1 = t1;
        }
        if ((double)sd < (double)local_58) {
          local_58 = sd;
        }
        if ((double)local_58 <= s1) {
          t0._4_4_ = 0;
        }
        else {
          t1 = s1;
          sd = local_58;
        }
      }
    }
    dVar1 = tolerance_local;
    if ((double)sd <= t1) {
      if (t1 <= (double)sd) {
        t0._4_4_ = 0;
        **(undefined8 **)((long)tolerance_local + 0x28) = 0;
        *(undefined8 *)(*(long *)((long)tolerance_local + 0x28) + 8) = 0x3ff0000000000000;
        ON_NurbsCurve::SetCV((ON_NurbsCurve *)tolerance_local,0,&(this->m_line).from);
        ON_NurbsCurve::SetCV((ON_NurbsCurve *)tolerance_local,1,&(this->m_line).to);
      }
      else {
        t0._4_4_ = 0;
        **(undefined8 **)((long)tolerance_local + 0x28) = sd;
        *(double *)(*(long *)((long)tolerance_local + 0x28) + 8) = t1;
        ON_Curve::PointAt(&local_a0,&this->super_ON_Curve,(double)sd);
        ON_NurbsCurve::SetCV((ON_NurbsCurve *)dVar1,0,&local_a0);
        dVar1 = tolerance_local;
        ON_Curve::PointAt(&local_b8,&this->super_ON_Curve,t1);
        ON_NurbsCurve::SetCV((ON_NurbsCurve *)dVar1,1,&local_b8);
      }
    }
    else {
      **(double **)((long)tolerance_local + 0x28) = t1;
      *(ON_Interval **)(*(long *)((long)tolerance_local + 0x28) + 8) = sd;
      ON_Curve::PointAt(&local_70,&this->super_ON_Curve,t1);
      ON_NurbsCurve::SetCV((ON_NurbsCurve *)dVar1,0,&local_70);
      dVar1 = tolerance_local;
      ON_Curve::PointAt(&local_88,&this->super_ON_Curve,(double)sd);
      ON_NurbsCurve::SetCV((ON_NurbsCurve *)dVar1,1,&local_88);
    }
  }
  return t0._4_4_;
}

Assistant:

int ON_LineCurve::GetNurbForm(
      ON_NurbsCurve& c,
      double tolerance,
      const ON_Interval* subdomain
      ) const
{
  int rc = 0;
  if ( c.Create( m_dim==2?2:3, false, 2, 2 ) ) 
  {
    rc = 1;
    double t0 = m_t[0];
    double t1 = m_t[1];
    if (subdomain )
    {
      if ( t0 < t1 )
      {
        const ON_Interval& sd = *subdomain;
        double s0 = sd[0];
        double s1 = sd[1];
        if (s0 < t0) s0 = t0;
        if (s1 > t1) s1 = t1;
        if (s0 < s1)
        {
          t0 = s0;
          t1 = s1;
        }
        else
          rc = 0;
      }
      else
      {
        rc = 0;
      }
    }  
    if ( t0 < t1 )
    {
      c.m_knot[0] = t0;
      c.m_knot[1] = t1;
      c.SetCV( 0, PointAt(t0));
      c.SetCV( 1, PointAt(t1));
    }
    else if ( t0 > t1 )
    {
      rc = 0;
      c.m_knot[0] = t1;
      c.m_knot[1] = t0;
      c.SetCV( 0, PointAt(t1));
      c.SetCV( 1, PointAt(t0));
    }
    else
    {
      rc = 0;
      c.m_knot[0] = 0.0;
      c.m_knot[1] = 1.0;
      c.SetCV( 0, m_line.from );
      c.SetCV( 1, m_line.to );
    }
  }
  return rc;
}